

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_realtime_diagnoses.cc
# Opt level: O0

void anon_unknown.dwarf_1590ba::Json2Type
               (Value *value,RdsDescribeRealtimeDiagnosesResponseType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  Json2Array<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType> local_39;
  string local_38;
  RdsDescribeRealtimeDiagnosesResponseType *local_18;
  RdsDescribeRealtimeDiagnosesResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribeRealtimeDiagnosesResponseType *)value;
  bVar1 = Json::Value::isMember(value,"Engine");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Engine");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->engine,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TotalRecordCount");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"TotalRecordCount");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->total_record_count = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PageNumber");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"PageNumber");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->page_number = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PageRecordCount");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"PageRecordCount");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->page_record_count = IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Tasks");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"Tasks");
    bVar1 = Json::Value::isMember(pVVar3,"RealtimeDiagnoseTasks");
    if (bVar1) {
      pVVar3 = Json::Value::operator[]((Value *)item_local,"Tasks");
      pVVar3 = Json::Value::operator[](pVVar3,"RealtimeDiagnoseTasks");
      Json2Array<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>::Json2Array
                (&local_39,pVVar3,&local_18->tasks);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribeRealtimeDiagnosesResponseType* item) {
  if(value.isMember("Engine")) {
    item->engine = value["Engine"].asString();
  }
  if(value.isMember("TotalRecordCount")) {
    item->total_record_count = value["TotalRecordCount"].asInt();
  }
  if(value.isMember("PageNumber")) {
    item->page_number = value["PageNumber"].asInt();
  }
  if(value.isMember("PageRecordCount")) {
    item->page_record_count = value["PageRecordCount"].asInt();
  }
  if(value.isMember("Tasks") && value["Tasks"].isMember("RealtimeDiagnoseTasks")) {
    Json2Array<RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>(value["Tasks"]["RealtimeDiagnoseTasks"], &item->tasks);
  }
}